

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::SstReader::DestructorClose(SstReader *this,bool Verbose)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,Verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"SST Reader \"",0xc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->super_Engine).m_Name._M_dataplus._M_p,
                        (this->super_Engine).m_Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"\" Destroyed without a prior Close().",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "This may result in \"unexpected close\" or \"failed to send\" warning from a connected SST Writer."
               ,0x5e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  (this->super_Engine).m_IsOpen = false;
  return;
}

Assistant:

void SstReader::DestructorClose(bool Verbose) noexcept
{
    if (Verbose)
    {
        std::cerr << "SST Reader \"" << m_Name << "\" Destroyed without a prior Close()."
                  << std::endl;
        std::cerr << "This may result in \"unexpected close\" or \"failed to "
                     "send\" warning from a connected SST Writer."
                  << std::endl;
    }
    m_IsOpen = false;
}